

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

uint8_t * google::protobuf::internal::WireFormat::InternalSerializeUnknownMessageSetItemsToArray
                    (UnknownFieldSet *unknown_fields,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  const_reference this;
  uint8_t *puVar2;
  int i;
  int index;
  
  index = 0;
  while( true ) {
    iVar1 = RepeatedField<google::protobuf::UnknownField>::size(&unknown_fields->fields_);
    if (iVar1 <= index) break;
    this = RepeatedField<google::protobuf::UnknownField>::Get(&unknown_fields->fields_,index);
    if (this->type_ == 3) {
      puVar2 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      puVar2 = io::CodedOutputStream::WriteVarint32ToArray(0xb,puVar2);
      puVar2 = io::CodedOutputStream::WriteVarint32ToArray(0x10,puVar2);
      puVar2 = io::CodedOutputStream::WriteVarint32ToArray(this->number_,puVar2);
      puVar2 = io::CodedOutputStream::WriteVarint32ToArray(0x1a,puVar2);
      puVar2 = UnknownField::InternalSerializeLengthDelimitedNoTag(this,puVar2,stream);
      puVar2 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar2);
      target = io::CodedOutputStream::WriteVarint32ToArray(0xc,puVar2);
    }
    index = index + 1;
  }
  return target;
}

Assistant:

uint8_t* WireFormat::InternalSerializeUnknownMessageSetItemsToArray(
    const UnknownFieldSet& unknown_fields, uint8_t* target,
    io::EpsCopyOutputStream* stream) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    // The only unknown fields that are allowed to exist in a MessageSet are
    // messages, which are length-delimited.
    if (field.type() == UnknownField::TYPE_LENGTH_DELIMITED) {
      target = stream->EnsureSpace(target);
      // Start group.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetItemStartTag, target);

      // Write type ID.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetTypeIdTag, target);
      target =
          io::CodedOutputStream::WriteVarint32ToArray(field.number(), target);

      // Write message.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetMessageTag, target);

      target = field.InternalSerializeLengthDelimitedNoTag(target, stream);

      target = stream->EnsureSpace(target);
      // End group.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetItemEndTag, target);
    }
  }

  return target;
}